

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter.cpp
# Opt level: O0

void __thiscall QCompleter::setModel(QCompleter *this,QAbstractItemModel *model)

{
  QCompleterPrivate *pQVar1;
  long *plVar2;
  QFileSystemModel *pQVar3;
  QObject *pQVar4;
  long *in_RSI;
  QObject *in_RDI;
  long in_FS_OFFSET;
  QCompleter *unaff_retaddr;
  QFileSystemModel *fsModel;
  QAbstractItemModel *oldModel;
  QCompleterPrivate *d;
  undefined8 in_stack_ffffffffffffffb8;
  CaseSensitivity cs;
  Connection local_10;
  QAbstractItemView *popup;
  
  cs = (CaseSensitivity)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  popup = *(QAbstractItemView **)(in_FS_OFFSET + 0x28);
  pQVar1 = d_func((QCompleter *)0xa6ca0f);
  plVar2 = (long *)QAbstractProxyModel::sourceModel();
  if (plVar2 != in_RSI) {
    pQVar3 = qobject_cast<QFileSystemModel_const*>((QObject *)0xa6ca45);
    if (pQVar3 != (QFileSystemModel *)0x0) {
      setCompletionRole((QCompleter *)in_RDI,cs);
    }
    (**(code **)(*(long *)pQVar1->proxy + 0x188))(pQVar1->proxy,in_RSI);
    if (pQVar1->popup != (QAbstractItemView *)0x0) {
      setPopup(unaff_retaddr,popup);
    }
    if ((plVar2 != (long *)0x0) && (pQVar4 = QObject::parent((QObject *)0xa6caab), pQVar4 == in_RDI)
       ) {
      if (plVar2 != (long *)0x0) {
        (**(code **)(*plVar2 + 0x20))();
      }
      cs = (CaseSensitivity)((ulong)plVar2 >> 0x20);
    }
    pQVar3 = qobject_cast<QFileSystemModel*>((QObject *)0xa6cada);
    if (pQVar3 != (QFileSystemModel *)0x0) {
      setCaseSensitivity((QCompleter *)in_RDI,cs);
      setCompletionRole((QCompleter *)in_RDI,cs);
      QObject::connect((QObject *)&local_10,(char *)pQVar3,(QObject *)"2directoryLoaded(QString)",
                       (char *)in_RDI,0xb4b584);
      QMetaObject::Connection::~Connection(&local_10);
    }
  }
  if (*(QAbstractItemView **)(in_FS_OFFSET + 0x28) != popup) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QCompleter::setModel(QAbstractItemModel *model)
{
    Q_D(QCompleter);
    QAbstractItemModel *oldModel = d->proxy->sourceModel();
    if (oldModel == model)
        return;
#if QT_CONFIG(filesystemmodel)
    if (qobject_cast<const QFileSystemModel *>(oldModel))
        setCompletionRole(Qt::EditRole); // QTBUG-54642, clear FileNameRole set by QFileSystemModel
#endif
    d->proxy->setSourceModel(model);
    if (d->popup)
        setPopup(d->popup); // set the model and make new connections
    if (oldModel && oldModel->QObject::parent() == this)
        delete oldModel;
#if QT_CONFIG(filesystemmodel)
    QFileSystemModel *fsModel = qobject_cast<QFileSystemModel *>(model);
    if (fsModel) {
#if defined(Q_OS_WIN)
        setCaseSensitivity(Qt::CaseInsensitive);
#else
        setCaseSensitivity(Qt::CaseSensitive);
#endif
        setCompletionRole(QFileSystemModel::FileNameRole);
        connect(fsModel, SIGNAL(directoryLoaded(QString)), this, SLOT(_q_fileSystemModelDirectoryLoaded(QString)));
    }
#endif // QT_CONFIG(filesystemmodel)
}